

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
poly::
vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
::push_back_new_elem_w_storage_increase<custom::CustImpl>
          (vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
           *this)

{
  size_type sVar1;
  unsigned_long *puVar2;
  my_base *this_00;
  allocator_type *__rhs;
  allocator_traits<std::allocator<unsigned_char>_> local_81;
  undefined1 local_80 [8];
  vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
  v;
  pair<unsigned_long,_unsigned_long> sizes;
  unsigned_long local_40;
  size_t local_38;
  unsigned_long new_capacity;
  bool nothrow_ctor;
  undefined8 uStack_28;
  bool noexcept_movable;
  unsigned_long a;
  unsigned_long s;
  vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
  *this_local;
  
  a = 8;
  uStack_28 = 8;
  new_capacity._7_1_ = 0;
  new_capacity._6_1_ = 1;
  s = (unsigned_long)this;
  sVar1 = capacity(this);
  local_40 = sVar1 * 2;
  sizes.second = 1;
  puVar2 = Catch::clara::std::max<unsigned_long>(&local_40,&sizes.second);
  local_38 = *puVar2;
  join_0x00000010_0x00000000_ = calculate_storage_size(this,local_38,8,8);
  this_00 = base(this);
  __rhs = vector_impl::allocator_base<std::allocator<unsigned_char>_>::get_allocator_ref(this_00);
  std::allocator_traits<std::allocator<unsigned_char>_>::select_on_container_copy_construction
            (&local_81,__rhs);
  vector((vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
          *)local_80,(allocator_type *)&local_81);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&local_81);
  init_layout((vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
               *)local_80,v._align_max,local_38,sizes.first);
  push_back_new_elem_w_storage_increase_copy(this,local_80);
  push_back_new_elem<custom::CustImpl>
            ((vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
              *)local_80);
  swap(this,(vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
             *)local_80);
  ~vector((vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
           *)local_80);
  return;
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}